

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void __thiscall QRegion::QRegion(QRegion *this,QPolygon *a,FillRule fillRule)

{
  qsizetype qVar1;
  QRegionPrivate *pQVar2;
  void *pvVar3;
  QList<QPoint> *in_RSI;
  long *in_RDI;
  QRegionPrivate *qt_rgn;
  int in_stack_000000a8;
  int in_stack_000000ac;
  QPoint *in_stack_000000b0;
  
  qVar1 = QList<QPoint>::size(in_RSI);
  if (qVar1 < 3) {
    *in_RDI = (long)&shared_empty;
  }
  else {
    QList<QPoint>::constData((QList<QPoint> *)0x65523e);
    QList<QPoint>::size(in_RSI);
    pQVar2 = PolygonRegion(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8);
    if (pQVar2 == (QRegionPrivate *)0x0) {
      *in_RDI = (long)&shared_empty;
    }
    else {
      pvVar3 = operator_new(0x10);
      *in_RDI = (long)pvVar3;
      QtPrivate::RefCount::initializeOwned((RefCount *)0x655294);
      *(QRegionPrivate **)(*in_RDI + 8) = pQVar2;
    }
  }
  return;
}

Assistant:

QRegion::QRegion(const QPolygon &a, Qt::FillRule fillRule)
{
    if (a.size() > 2) {
        QRegionPrivate *qt_rgn = PolygonRegion(a.constData(), a.size(),
                                               fillRule == Qt::WindingFill ? WindingRule : EvenOddRule);
        if (qt_rgn) {
            d =  new QRegionData;
            d->ref.initializeOwned();
            d->qt_rgn = qt_rgn;
        } else {
            d = const_cast<QRegionData*>(&shared_empty);
        }
    } else {
        d = const_cast<QRegionData*>(&shared_empty);
    }
}